

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

float ImGui::GetNavTweakPressedAmount(ImGuiAxis axis)

{
  ImGuiKey key;
  int iVar1;
  int iVar2;
  ImGuiContext *g;
  ImGuiKey key_00;
  bool bVar3;
  float repeat_delay;
  float repeat_rate;
  float local_1c;
  
  repeat_delay = (GImGui->IO).KeyRepeatDelay * 0.72;
  repeat_rate = (GImGui->IO).KeyRepeatRate * 0.3;
  bVar3 = axis != ImGuiAxis_X;
  key_00 = bVar3 + 0x202 + (uint)bVar3;
  key = bVar3 + 0x201 + (uint)bVar3;
  if (GImGui->NavInputSource == ImGuiInputSource_Gamepad) {
    key_00 = bVar3 + 0x270 + (uint)bVar3;
    key = bVar3 + 0x26f + (uint)bVar3;
  }
  iVar1 = GetKeyPressedAmount(key_00,repeat_delay,repeat_rate);
  iVar2 = GetKeyPressedAmount(key,repeat_delay,repeat_rate);
  local_1c = (float)iVar1 - (float)iVar2;
  if ((((local_1c != 0.0) || (NAN(local_1c))) && (bVar3 = IsKeyDown(key), bVar3)) &&
     (bVar3 = IsKeyDown(key_00), bVar3)) {
    local_1c = 0.0;
  }
  return local_1c;
}

Assistant:

float ImGui::GetNavTweakPressedAmount(ImGuiAxis axis)
{
    ImGuiContext& g = *GImGui;
    float repeat_delay, repeat_rate;
    GetTypematicRepeatRate(ImGuiInputFlags_RepeatRateNavTweak, &repeat_delay, &repeat_rate);

    ImGuiKey key_less, key_more;
    if (g.NavInputSource == ImGuiInputSource_Gamepad)
    {
        key_less = (axis == ImGuiAxis_X) ? ImGuiKey_GamepadDpadLeft : ImGuiKey_GamepadDpadUp;
        key_more = (axis == ImGuiAxis_X) ? ImGuiKey_GamepadDpadRight : ImGuiKey_GamepadDpadDown;
    }
    else
    {
        key_less = (axis == ImGuiAxis_X) ? ImGuiKey_LeftArrow : ImGuiKey_UpArrow;
        key_more = (axis == ImGuiAxis_X) ? ImGuiKey_RightArrow : ImGuiKey_DownArrow;
    }
    float amount = (float)GetKeyPressedAmount(key_more, repeat_delay, repeat_rate) - (float)GetKeyPressedAmount(key_less, repeat_delay, repeat_rate);
    if (amount != 0.0f && IsKeyDown(key_less) && IsKeyDown(key_more)) // Cancel when opposite directions are held, regardless of repeat phase
        amount = 0.0f;
    return amount;
}